

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O2

void armci_write_strided(void *ptr,int stride_levels,int *stride_arr,int *count,char *buf)

{
  void *__src;
  size_t __n;
  stride_info_t sitr;
  stride_info_t local_90;
  
  __n = (size_t)*count;
  if (0 < (long)__n) {
    armci_stride_info_init(&local_90,ptr,stride_levels,stride_arr,count);
    while (local_90.pos < local_90.size) {
      __src = armci_stride_info_seg_ptr(&local_90);
      memcpy(buf,__src,__n);
      armci_stride_info_next(&local_90);
      buf = buf + __n;
    }
    return;
  }
  __assert_fail("count[0]>0",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                ,0xa5,"void armci_write_strided(void *, int, int *, int *, char *)");
}

Assistant:

void armci_write_strided(
        void *ptr, int stride_levels, int stride_arr[], int count[], char *buf)
{
  const int seg_size = count[0];
  int off;
  stride_info_t sitr;
  off=0;
  assert(count[0]>0);
  armci_stride_info_init(&sitr,ptr,stride_levels,stride_arr,count);
  while(armci_stride_info_has_more(&sitr)) {
    char *sptr = armci_stride_info_seg_ptr(&sitr);
    memcpy(&buf[off],sptr,seg_size);
    off += seg_size;
    armci_stride_info_next(&sitr);
  }
  armci_stride_info_destroy(&sitr);
}